

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::FindUsedVertices(FNodeBuilder *this,vertex_t *oldverts,int max)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ptrdiff_t v2;
  ptrdiff_t v1;
  fixed_t local_38;
  FPrivVert newvert;
  int i;
  int *map;
  int max_local;
  vertex_t *oldverts_local;
  FNodeBuilder *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)max;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  register0x00000000 = (int *)operator_new__(uVar3);
  memset(register0x00000000,0xff,(long)max << 2);
  for (newvert.segs = 0; (int)newvert.segs < this->Level->NumLines; newvert.segs = newvert.segs + 1)
  {
    lVar5 = (long)this->Level->Lines[(int)newvert.segs].v1 - (long)oldverts >> 4;
    lVar4 = (long)this->Level->Lines[(int)newvert.segs].v2 - (long)oldverts >> 4;
    if (stack0xffffffffffffffd8[lVar5] == -1) {
      v1._4_4_ = vertex_t::fixX(oldverts + lVar5);
      local_38 = vertex_t::fixY(oldverts + lVar5);
      iVar2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,(long)&v1 + 4);
      stack0xffffffffffffffd8[lVar5] = iVar2;
    }
    if (stack0xffffffffffffffd8[lVar4] == -1) {
      v1._4_4_ = vertex_t::fixX(oldverts + lVar4);
      local_38 = vertex_t::fixY(oldverts + lVar4);
      iVar2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,(long)&v1 + 4);
      stack0xffffffffffffffd8[lVar4] = iVar2;
    }
    this->Level->Lines[(int)newvert.segs].v1 = (vertex_t *)(long)stack0xffffffffffffffd8[lVar5];
    this->Level->Lines[(int)newvert.segs].v2 = (vertex_t *)(long)stack0xffffffffffffffd8[lVar4];
  }
  this->OldVertexTable = stack0xffffffffffffffd8;
  return;
}

Assistant:

void FNodeBuilder::FindUsedVertices (vertex_t *oldverts, int max)
{
	int *map = new int[max];
	int i;
	FPrivVert newvert;

	memset (&map[0], -1, sizeof(int)*max);

	for (i = 0; i < Level.NumLines; ++i)
	{
		ptrdiff_t v1 = Level.Lines[i].v1 - oldverts;
		ptrdiff_t v2 = Level.Lines[i].v2 - oldverts;

		if (map[v1] == -1)
		{
			newvert.x = oldverts[v1].fixX();
			newvert.y = oldverts[v1].fixY();
			map[v1] = VertexMap->SelectVertexExact (newvert);
		}
		if (map[v2] == -1)
		{
			newvert.x = oldverts[v2].fixX();
			newvert.y = oldverts[v2].fixY();
			map[v2] = VertexMap->SelectVertexExact (newvert);
		}

		Level.Lines[i].v1 = (vertex_t *)(size_t)map[v1];
		Level.Lines[i].v2 = (vertex_t *)(size_t)map[v2];
	}
	OldVertexTable = map;
}